

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O1

wchar_t c_hpos(EditLine *el)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  long lVar4;
  long lVar5;
  
  pwVar2 = (el->el_line).buffer;
  pwVar3 = (el->el_line).cursor;
  if (pwVar3 == pwVar2) {
    return L'\0';
  }
  lVar4 = -4;
  do {
    lVar5 = lVar4;
    pwVar1 = (wchar_t *)((long)pwVar3 + lVar5);
    if (pwVar1 < pwVar2) break;
    lVar4 = lVar5 + -4;
  } while (*pwVar1 != L'\n');
  return (int)((ulong)-lVar5 >> 2) + L'\xffffffff';
}

Assistant:

libedit_private int
c_hpos(EditLine *el)
{
	wchar_t *ptr;

	/*
	 * Find how many characters till the beginning of this line.
	 */
	if (el->el_line.cursor == el->el_line.buffer)
		return 0;
	else {
		for (ptr = el->el_line.cursor - 1;
		     ptr >= el->el_line.buffer && *ptr != '\n';
		     ptr--)
			continue;
		return (int)(el->el_line.cursor - ptr - 1);
	}
}